

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_arith(lua_State *L,int op)

{
  StkId pTVar1;
  StkId pTVar2;
  undefined4 uVar3;
  TValue *io1;
  int op_local;
  lua_State *L_local;
  
  if ((op == 0xc) || (op == 0xd)) {
    pTVar1 = L->top;
    pTVar2 = L->top;
    pTVar1->value_ = pTVar2[-1].value_;
    uVar3 = *(undefined4 *)&pTVar2[-1].field_0xc;
    pTVar1->tt_ = pTVar2[-1].tt_;
    *(undefined4 *)&pTVar1->field_0xc = uVar3;
    L->top = L->top + 1;
  }
  luaO_arith(L,op,L->top + -2,L->top + -1,L->top + -2);
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_arith(lua_State *L, int op) {
    lua_lock(L);
    if (op != LUA_OPUNM && op != LUA_OPBNOT)
        api_checknelems(L, 2);  /* all other operations expect two operands */
    else {  /* for unary operations, add fake 2nd operand */
        api_checknelems(L, 1);
        setobjs2s(L, L->top, L->top - 1);
        api_incr_top(L);
    }
    /* first operand at top - 2, second at top - 1; result go to top - 2 */
    luaO_arith(L, op, L->top - 2, L->top - 1, L->top - 2);
    L->top--;  /* remove second operand */
    lua_unlock(L);
}